

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

bool llvm::operator<(StringRef LHS,StringRef RHS)

{
  int iVar1;
  uint uVar2;
  ulong __n;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = LHS.Length;
  uVar3 = RHS.Length;
  __n = uVar4;
  if (uVar3 < uVar4) {
    __n = uVar3;
  }
  if (__n == 0) {
LAB_0018dc65:
    uVar2 = 0;
    if (uVar4 == uVar3) goto LAB_0018dc76;
    uVar2 = -(uint)(uVar4 < uVar3);
  }
  else {
    iVar1 = memcmp(LHS.Data,RHS.Data,__n);
    if (iVar1 == 0) goto LAB_0018dc65;
    uVar2 = iVar1 >> 0x1f;
  }
  uVar2 = uVar2 | 1;
LAB_0018dc76:
  return uVar2 == 0xffffffff;
}

Assistant:

inline bool operator<(StringRef LHS, StringRef RHS) {
    return LHS.compare(RHS) == -1;
  }